

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * google::protobuf::FastHexToBuffer(int i,char *buffer)

{
  LogMessage *pLVar1;
  char *pcVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (i < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x377);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: i >= 0: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"FastHexToBuffer() wants non-negative integers, not ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,i);
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  buffer[0x15] = '\0';
  pcVar2 = buffer + 0x15;
  do {
    pcVar2[-1] = "0123456789abcdef"[i & 0xf];
    pcVar2 = pcVar2 + -1;
    i = i >> 4;
  } while (0 < i);
  return pcVar2;
}

Assistant:

char *FastHexToBuffer(int i, char* buffer) {
  GOOGLE_CHECK(i >= 0) << "FastHexToBuffer() wants non-negative integers, not " << i;

  static const char *hexdigits = "0123456789abcdef";
  char *p = buffer + 21;
  *p-- = '\0';
  do {
    *p-- = hexdigits[i & 15];   // mod by 16
    i >>= 4;                    // divide by 16
  } while (i > 0);
  return p + 1;
}